

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_framebuffer.cpp
# Opt level: O2

bool __thiscall OpenGLFrameBuffer::Begin2D(OpenGLFrameBuffer *this,bool param_1)

{
  VSMatrix::loadIdentity(&gl_RenderState.mViewMatrix);
  VSMatrix::ortho(&gl_RenderState.mProjectionMatrix,0.0,
                  (float)(this->super_SDLGLFB).super_DFrameBuffer.super_DSimpleCanvas.super_DCanvas.
                         Width,
                  (float)(this->super_SDLGLFB).super_DFrameBuffer.super_DSimpleCanvas.super_DCanvas.
                         Height,0.0,-1.0,1.0);
  FRenderState::ApplyMatrices(&gl_RenderState);
  (*_ptrc_glDisable)(0xb71);
  if (gl_aalines.Value == true) {
    (*_ptrc_glEnable)(0xb20);
  }
  else {
    (*_ptrc_glDisable)(0x809d);
    (*_ptrc_glDisable)(0xb20);
    (*_ptrc_glLineWidth)(1.0);
  }
  if (GLRenderer != (FGLRenderer *)0x0) {
    FGLRenderer::Begin2D(GLRenderer);
  }
  return true;
}

Assistant:

bool OpenGLFrameBuffer::Begin2D(bool)
{
	gl_RenderState.mViewMatrix.loadIdentity();
	gl_RenderState.mProjectionMatrix.ortho(0, GetWidth(), GetHeight(), 0, -1.0f, 1.0f);
	gl_RenderState.ApplyMatrices();

	glDisable(GL_DEPTH_TEST);

	// Korshun: ENABLE AUTOMAP ANTIALIASING!!!
	if (gl_aalines)
		glEnable(GL_LINE_SMOOTH);
	else
	{
		glDisable(GL_MULTISAMPLE);
		glDisable(GL_LINE_SMOOTH);
		glLineWidth(1.0);
	}

	if (GLRenderer != NULL)
			GLRenderer->Begin2D();
	return true;
}